

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplicialCholesky.h
# Opt level: O3

void __thiscall
Eigen::
SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
::_solve_impl<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
          (SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,0,int>,1,Eigen::AMDOrdering<int>>>
           *this,MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *b,
          MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *dest)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  PointerType piVar6;
  SparseMatrix<double,_0,_int> *pSVar7;
  long lVar8;
  double dVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  int iVar12;
  Index index;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ActualDstType actualDst;
  ulong uVar16;
  undefined1 auVar17 [16];
  scalar_sum_op<int,_int> local_61;
  undefined1 local_60 [8];
  Transpose<const_Eigen::SparseMatrix<double,_0,_int>_> local_58;
  XprType *local_48;
  XprType local_40;
  
  if (*(int *)(this + 4) != 0) {
    return;
  }
  lVar5 = *(long *)(this + 0x90);
  if (lVar5 < 1) {
    lVar5 = *(long *)b;
    uVar16 = *(ulong *)(b + 8);
    if (*(ulong *)(dest + 8) != uVar16) {
      PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest,uVar16,1);
      uVar16 = *(ulong *)(dest + 8);
    }
    lVar8 = *(long *)dest;
    uVar13 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar16) {
      lVar14 = 0;
      do {
        puVar1 = (undefined8 *)(lVar5 + lVar14 * 8);
        uVar10 = puVar1[1];
        puVar2 = (undefined8 *)(lVar8 + lVar14 * 8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar10;
        lVar14 = lVar14 + 2;
      } while (lVar14 < (long)uVar13);
    }
    if ((long)uVar13 < (long)uVar16) {
      do {
        *(undefined8 *)(lVar8 + uVar13 * 8) = *(undefined8 *)(lVar5 + uVar13 * 8);
        uVar13 = uVar13 + 1;
      } while (uVar16 != uVar13);
    }
  }
  else {
    if (*(long *)(dest + 8) != lVar5) {
      PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest,lVar5,1);
    }
    internal::
    permutation_matrix_product<Eigen::Matrix<double,-1,1,0,-1,1>,1,false,Eigen::DenseShape>::
    run<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::PermutationMatrix<_1,_1,int>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)dest,
               (PermutationMatrix<_1,__1,_int> *)(this + 0x88),(Matrix<double,__1,_1,_0,__1,_1> *)b)
    ;
  }
  piVar6 = *(PointerType *)(this + 0x30);
  if (piVar6 == (PointerType)0x0) {
    iVar12 = (*(int **)(this + 0x28))[*(long *)(this + 0x18)] - **(int **)(this + 0x28);
LAB_0014381f:
    if (0 < iVar12) {
      internal::
      sparse_solve_triangular_selector<const_Eigen::SparseMatrix<double,_0,_int>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_5,_1,_0>
      ::run((SparseMatrix<double,_0,_int> *)(this + 0x10),(Matrix<double,__1,_1,_0,__1,_1> *)dest);
    }
  }
  else {
    pSVar7 = *(SparseMatrix<double,_0,_int> **)(this + 0x18);
    if (pSVar7 != (SparseMatrix<double,_0,_int> *)0x0) {
      local_48 = &local_40;
      local_60 = (undefined1  [8])piVar6;
      local_58.m_matrix = pSVar7;
      local_40.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = piVar6;
      local_40.
      super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value = (long)pSVar7;
      iVar12 = internal::
               redux_impl<Eigen::internal::scalar_sum_op<int,_int>,_Eigen::internal::redux_evaluator<Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_3,_0>
               ::run((redux_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                      *)local_60,&local_61);
      goto LAB_0014381f;
    }
  }
  uVar16 = *(ulong *)(this + 0x60);
  if (0 < (long)uVar16) {
    lVar5 = *(long *)(this + 0x58);
    lVar8 = *(long *)dest;
    lVar14 = lVar8;
    if (*(ulong *)(dest + 8) != uVar16) {
      PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest,uVar16,1);
      uVar16 = *(ulong *)(dest + 8);
      lVar14 = *(long *)dest;
    }
    auVar11 = _DAT_0019a850;
    uVar13 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar16) {
      lVar15 = 0;
      do {
        auVar17 = divpd(auVar11,*(undefined1 (*) [16])(lVar5 + lVar15 * 8));
        pdVar4 = (double *)(lVar8 + lVar15 * 8);
        dVar9 = pdVar4[1];
        pdVar3 = (double *)(lVar14 + lVar15 * 8);
        *pdVar3 = auVar17._0_8_ * *pdVar4;
        pdVar3[1] = auVar17._8_8_ * dVar9;
        lVar15 = lVar15 + 2;
      } while (lVar15 < (long)uVar13);
    }
    if ((long)uVar13 < (long)uVar16) {
      do {
        *(double *)(lVar14 + uVar13 * 8) =
             (1.0 / *(double *)(lVar5 + uVar13 * 8)) * *(double *)(lVar8 + uVar13 * 8);
        uVar13 = uVar13 + 1;
      } while (uVar16 != uVar13);
    }
  }
  piVar6 = *(PointerType *)(this + 0x30);
  if (piVar6 == (PointerType)0x0) {
    iVar12 = (*(int **)(this + 0x28))[*(long *)(this + 0x18)] - **(int **)(this + 0x28);
  }
  else {
    pSVar7 = *(SparseMatrix<double,_0,_int> **)(this + 0x18);
    if (pSVar7 == (SparseMatrix<double,_0,_int> *)0x0) goto LAB_0014392c;
    local_48 = &local_40;
    local_60 = (undefined1  [8])piVar6;
    local_58.m_matrix = pSVar7;
    local_40.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_data = piVar6;
    local_40.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_rows.m_value = (long)pSVar7;
    iVar12 = internal::
             redux_impl<Eigen::internal::scalar_sum_op<int,_int>,_Eigen::internal::redux_evaluator<Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_3,_0>
             ::run((redux_evaluator<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)local_60,&local_61);
  }
  if (0 < iVar12) {
    local_60 = (undefined1  [8])((ulong)local_60 & 0xffffffffffffff00);
    local_58.super_TransposeImpl<const_Eigen::SparseMatrix<double,_0,_int>,_Eigen::Sparse>.
    super_SparseTransposeImpl<const_Eigen::SparseMatrix<double,_0,_int>,_1024>.
    super_SparseCompressedBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>.
    super_SparseMatrixBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>.m_isRValue
         = (SparseTransposeImpl<const_Eigen::SparseMatrix<double,_0,_int>,_1024>)
           (SparseCompressedBase<Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>_>)0x0;
    local_58.m_matrix = (SparseMatrix<double,_0,_int> *)(this + 0x10);
    internal::
    sparse_solve_triangular_selector<const_Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_6,_2,_1>
    ::run(&local_58,(Matrix<double,__1,_1,_0,__1,_1> *)dest);
  }
LAB_0014392c:
  if (0 < *(long *)(this + 0x90)) {
    if (*(long *)(dest + 8) != *(long *)(this + 0xa0)) {
      PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)dest,
                 *(long *)(this + 0xa0),1);
    }
    internal::
    permutation_matrix_product<Eigen::Matrix<double,-1,1,0,-1,1>,1,false,Eigen::DenseShape>::
    run<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::PermutationMatrix<_1,_1,int>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)dest,
               (PermutationMatrix<_1,__1,_int> *)(this + 0x98),
               (Matrix<double,__1,_1,_0,__1,_1> *)dest);
  }
  return;
}

Assistant:

void _solve_impl(const MatrixBase<Rhs> &b, MatrixBase<Dest> &dest) const
    {
      eigen_assert(m_factorizationIsOk && "The decomposition is not in a valid state for solving, you must first call either compute() or symbolic()/numeric()");
      eigen_assert(m_matrix.rows()==b.rows());

      if(m_info!=Success)
        return;

      if(m_P.size()>0)
        dest = m_P * b;
      else
        dest = b;

      if(m_matrix.nonZeros()>0) // otherwise L==I
        derived().matrixL().solveInPlace(dest);

      if(m_diag.size()>0)
        dest = m_diag.asDiagonal().inverse() * dest;

      if (m_matrix.nonZeros()>0) // otherwise U==I
        derived().matrixU().solveInPlace(dest);

      if(m_P.size()>0)
        dest = m_Pinv * dest;
    }